

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O1

void __thiscall
chrono::ChArchiveIn::in<myEmployeeBoss>
          (ChArchiveIn *this,ChNameValue<std::shared_ptr<myEmployeeBoss>_> *bVal)

{
  shared_ptr<myEmployeeBoss> *psVar1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  myEmployeeBoss *pmVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  int iVar6;
  undefined4 extraout_var;
  mapped_type *pmVar7;
  myEmployeeBoss *__tmp;
  ulong uVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __node_base_ptr p_Var9;
  __node_base_ptr p_Var10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  element_type *peVar12;
  myEmployeeBoss *mptr;
  ChFunctorArchiveInSpecificPtr<myEmployeeBoss> specFuncA;
  myEmployeeBoss *local_60;
  myEmployeeBoss *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  undefined **local_40;
  myEmployeeBoss **local_38;
  char *local_30;
  undefined ***local_28;
  char local_20;
  
  local_28 = &local_40;
  local_40 = &PTR__ChFunctorArchiveIn_0015aa00;
  local_38 = &local_60;
  local_30 = bVal->_name;
  local_20 = bVal->_flags;
  iVar6 = (*(this->super_ChArchive)._vptr_ChArchive[0xd])();
  if (CONCAT44(extraout_var,iVar6) == 0) {
    uVar2 = (this->shared_ptr_map)._M_h._M_bucket_count;
    uVar8 = (ulong)local_60 % uVar2;
    p_Var9 = (this->shared_ptr_map)._M_h._M_buckets[uVar8];
    p_Var10 = (__node_base_ptr)0x0;
    if ((p_Var9 != (__node_base_ptr)0x0) &&
       (p_Var3 = p_Var9->_M_nxt, p_Var10 = p_Var9,
       local_60 != (myEmployeeBoss *)p_Var9->_M_nxt[1]._M_nxt)) {
      while (p_Var9 = p_Var3, p_Var3 = p_Var9->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
        p_Var10 = (__node_base_ptr)0x0;
        if (((ulong)p_Var3[1]._M_nxt % uVar2 != uVar8) ||
           (p_Var10 = p_Var9, local_60 == (myEmployeeBoss *)p_Var3[1]._M_nxt)) goto LAB_0013de61;
      }
      p_Var10 = (__node_base_ptr)0x0;
    }
LAB_0013de61:
    if ((p_Var10 != (__node_base_ptr)0x0) && (p_Var10->_M_nxt != (_Hash_node_base *)0x0)) {
      local_58 = local_60;
      pmVar7 = std::__detail::
               _Map_base<void_*,_std::pair<void_*const,_std::shared_ptr<void>_>,_std::allocator<std::pair<void_*const,_std::shared_ptr<void>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<void_*,_std::pair<void_*const,_std::shared_ptr<void>_>,_std::allocator<std::pair<void_*const,_std::shared_ptr<void>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->shared_ptr_map,&local_58);
      peVar12 = (element_type *)
                (pmVar7->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var11 = (pmVar7->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
        }
      }
      psVar1 = bVal->_value;
      (psVar1->super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar12;
      this_00 = (psVar1->super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
                ._M_pi;
      (psVar1->super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
           p_Var11;
      goto LAB_0013df3b;
    }
    local_58 = local_60;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<myEmployeeBoss*>
              (a_Stack_50,local_60);
    _Var5._M_pi = a_Stack_50[0]._M_pi;
    pmVar4 = local_58;
    psVar1 = bVal->_value;
    local_58 = (myEmployeeBoss *)0x0;
    a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var11 = (psVar1->super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
    (psVar1->super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pmVar4;
    (psVar1->super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
    }
    if (a_Stack_50[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
    }
    peVar12 = (bVal->_value->super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var11 = (bVal->_value->super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
      }
    }
    local_58 = local_60;
    pmVar7 = std::__detail::
             _Map_base<void_*,_std::pair<void_*const,_std::shared_ptr<void>_>,_std::allocator<std::pair<void_*const,_std::shared_ptr<void>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<void_*,_std::pair<void_*const,_std::shared_ptr<void>_>,_std::allocator<std::pair<void_*const,_std::shared_ptr<void>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->shared_ptr_map,&local_58);
  }
  else {
    local_58 = local_60;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<myEmployeeBoss*>
              (a_Stack_50,local_60);
    _Var5._M_pi = a_Stack_50[0]._M_pi;
    pmVar4 = local_58;
    psVar1 = bVal->_value;
    local_58 = (myEmployeeBoss *)0x0;
    a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var11 = (psVar1->super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
    (psVar1->super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pmVar4;
    (psVar1->super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
    }
    if (a_Stack_50[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
    }
    peVar12 = (bVal->_value->super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var11 = (bVal->_value->super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
      }
    }
    local_58 = local_60;
    pmVar7 = std::__detail::
             _Map_base<void_*,_std::pair<void_*const,_std::shared_ptr<void>_>,_std::allocator<std::pair<void_*const,_std::shared_ptr<void>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<void_*,_std::pair<void_*const,_std::shared_ptr<void>_>,_std::allocator<std::pair<void_*const,_std::shared_ptr<void>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->shared_ptr_map,&local_58);
  }
  (pmVar7->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar12;
  this_00 = (pmVar7->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (pmVar7->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var11;
LAB_0013df3b:
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void in     (ChNameValue< std::shared_ptr<T> > bVal) {
          T* mptr;
          ChFunctorArchiveInSpecificPtr<T> specFuncA(&mptr);
          ChNameValue<ChFunctorArchiveIn> mtmp(bVal.name(), specFuncA, bVal.flags());
          void* newptr = this->in_ref(mtmp);

          // Some additional complication respect to raw pointers: 
          // it must properly increment shared count of shared pointers.
          if(newptr) {
              // case A: new object, so just make a shared ptr with initial count=1
              bVal.value() = std::shared_ptr<T> ( mptr ); 
              this->shared_ptr_map[mptr] = std::static_pointer_cast<void>(bVal.value());
          }
          else {
              if (this->shared_ptr_map.find(mptr) != this->shared_ptr_map.end()) {
                  // case B1: preexisting object, previously referenced by a shared ptr, so increment ref count
                  bVal.value() = std::static_pointer_cast<T>(shared_ptr_map[mptr]);
              }
              else {
                  // case B2: preexisting object, but not referenced by shared ptr (maybe by some raw ptr) so just make a shared ptr with initial count=1
                  bVal.value() = std::shared_ptr<T> ( mptr ); 
                  this->shared_ptr_map[mptr] = std::static_pointer_cast<void>(bVal.value());
              }
          }
      }